

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O1

int messagereceiver_close(MESSAGE_RECEIVER_HANDLE message_receiver)

{
  MESSAGE_RECEIVER_STATE MVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  MESSAGE_RECEIVER_STATE previous_state;
  int iVar4;
  
  if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar4 = 0x18b;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                ,"messagereceiver_close",0x18a,1,"NULL message_receiver");
    }
  }
  else {
    MVar1 = message_receiver->message_receiver_state;
    iVar4 = 0;
    if ((MVar1 & ~MESSAGE_RECEIVER_STATE_IDLE) == MESSAGE_RECEIVER_STATE_OPENING) {
      message_receiver->message_receiver_state = MESSAGE_RECEIVER_STATE_CLOSING;
      if (message_receiver->on_message_receiver_state_changed !=
          (ON_MESSAGE_RECEIVER_STATE_CHANGED)0x0) {
        (*message_receiver->on_message_receiver_state_changed)
                  (message_receiver->on_message_receiver_state_changed_context,
                   MESSAGE_RECEIVER_STATE_CLOSING,MVar1);
      }
      iVar4 = 0;
      iVar2 = link_detach(message_receiver->link,true,(char *)0x0,(char *)0x0,(AMQP_VALUE)0x0);
      if (iVar2 != 0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                    ,"messagereceiver_close",0x196,1,"link detach failed");
        }
        MVar1 = message_receiver->message_receiver_state;
        message_receiver->message_receiver_state = MESSAGE_RECEIVER_STATE_ERROR;
        iVar4 = 0x197;
        if (message_receiver->on_message_receiver_state_changed !=
            (ON_MESSAGE_RECEIVER_STATE_CHANGED)0x0) {
          (*message_receiver->on_message_receiver_state_changed)
                    (message_receiver->on_message_receiver_state_changed_context,
                     MESSAGE_RECEIVER_STATE_ERROR,MVar1);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int messagereceiver_close(MESSAGE_RECEIVER_HANDLE message_receiver)
{
    int result;

    if (message_receiver == NULL)
    {
        LogError("NULL message_receiver");
        result = MU_FAILURE;
    }
    else
    {
        if ((message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPENING) ||
            (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPEN))
        {
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_CLOSING);

            if (link_detach(message_receiver->link, true, NULL, NULL, NULL) != 0)
            {
                LogError("link detach failed");
                result = MU_FAILURE;
                set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
            }
            else
            {
                result = 0;
            }
        }
        else
        {
            result = 0;
        }
    }

    return result;
}